

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerProfiledBeginSwitch(Lowerer *this,JitProfilingInstr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *opndArg;
  IntConstOpnd *opndArg_00;
  AddrOpnd *opndArg_01;
  HelperCallOpnd *newSrc;
  JitProfilingInstr *instr_local;
  Lowerer *this_local;
  
  if (((byte)instr->field_0x60 >> 1 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6805,"(instr->isBeginSwitch)","instr->isBeginSwitch");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  opndArg = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,opndArg);
  opndArg_00 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg_00->super_Opnd);
  opndArg_01 = CreateFunctionBodyOpnd(this,(instr->super_Instr).m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg_01->super_Opnd);
  newSrc = IR::HelperCallOpnd::New(HelperSimpleProfiledSwitch,this->m_func);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledBeginSwitch(IR::JitProfilingInstr* instr)
{
    Assert(instr->isBeginSwitch);

    m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, m_func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(instr->m_func));
    instr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperSimpleProfiledSwitch, m_func));
    m_lowererMD.LowerCall(instr, 0);
}